

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O0

bool __thiscall Refal2::CRuleParser::BeginFunction(CRuleParser *this)

{
  TLabel TVar1;
  byte local_19;
  CRuleParser *this_local;
  
  local_19 = 0;
  if ((this->super_CQualifierParser).token.type == TT_Word) {
    local_19 = std::__cxx11::string::empty();
    local_19 = local_19 ^ 0xff;
  }
  if ((local_19 & 1) != 0) {
    TVar1 = CModuleBuilder::Declare((CModuleBuilder *)this,&(this->super_CQualifierParser).token);
    if (TVar1 != -1) {
      CToken::operator=(&this->functionName,&(this->super_CQualifierParser).token);
      beginRule(this);
    }
    return TVar1 != -1;
  }
  __assert_fail("token.type == TT_Word && !token.word.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                ,0x19,"bool Refal2::CRuleParser::BeginFunction()");
}

Assistant:

bool CRuleParser::BeginFunction()
{
	assert( token.type == TT_Word && !token.word.empty() );
	if( CModuleBuilder::Declare( token ) != InvalidDictionaryIndex ) {
		functionName = token;
		beginRule();
		return true;
	}
	return false;
}